

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3SetJoinExpr(Expr *p,int iTable,u32 joinFlag)

{
  uint in_EDX;
  undefined4 in_ESI;
  char *in_RDI;
  int i;
  u32 in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  char *local_8;
  
  for (local_8 = in_RDI; local_8 != (char *)0x0; local_8 = *(char **)(local_8 + 0x18)) {
    *(uint *)(local_8 + 4) = in_EDX | *(uint *)(local_8 + 4);
    *(undefined4 *)(local_8 + 0x34) = in_ESI;
    if ((*local_8 == -0x54) && (*(long *)(local_8 + 0x20) != 0)) {
      for (in_stack_ffffffffffffffec = 0; in_stack_ffffffffffffffec < **(int **)(local_8 + 0x20);
          in_stack_ffffffffffffffec = in_stack_ffffffffffffffec + 1) {
        sqlite3SetJoinExpr((Expr *)CONCAT44(in_ESI,in_EDX),in_stack_ffffffffffffffec,
                           in_stack_ffffffffffffffe8);
      }
    }
    sqlite3SetJoinExpr((Expr *)CONCAT44(in_ESI,in_EDX),in_stack_ffffffffffffffec,
                       in_stack_ffffffffffffffe8);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3SetJoinExpr(Expr *p, int iTable, u32 joinFlag){
  assert( joinFlag==EP_OuterON || joinFlag==EP_InnerON );
  while( p ){
    ExprSetProperty(p, joinFlag);
    assert( !ExprHasProperty(p, EP_TokenOnly|EP_Reduced) );
    ExprSetVVAProperty(p, EP_NoReduce);
    p->w.iJoin = iTable;
    if( p->op==TK_FUNCTION ){
      assert( ExprUseXList(p) );
      if( p->x.pList ){
        int i;
        for(i=0; i<p->x.pList->nExpr; i++){
          sqlite3SetJoinExpr(p->x.pList->a[i].pExpr, iTable, joinFlag);
        }
      }
    }
    sqlite3SetJoinExpr(p->pLeft, iTable, joinFlag);
    p = p->pRight;
  }
}